

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test::
~cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test
          (cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test
            ((cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test *)0x3732a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, BlindDestroyAmountTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* base_tx = "0200000000020fd1d25bb34f2fb499304dec92571f88f553891aceda376533fb8d76fc64b0ea0000000000ffffffffd2b787c00072aa8a46bf77d04017cfc73665fc2a3945af0ac43ef2ed2eca1e4a0100000000ffffffff0301c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d20100000000000f424000016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000001c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d201000000000000000003edd71a5d0cd1e82e48ec3e26bfbfecb053b2a196e3ce56752312cc81e7eaca72016a00000000";

  char* tx_string = nullptr;
  int64_t satoshi;
  void* blind_handle = nullptr;
  ret = CfdInitializeBlindTx(handle, &blind_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    satoshi = 1000000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "eab064fc768dfb336537dace1a8953f5881f5792ec4d3099b42f4fb35bd2d10f", 0,
        "d209585084f73d815926859c8f234dff59615344045d212a93c7d080093dbdc7",
        "44c2852117c44c7a43833d5a681f09ec6120d889bb70891627d30a122ff24047",
        "3a2916b1ddd3514b32c533116e02b1262fc9df455df55d82a30197f4a81e9580",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 10000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "4a1eca2eedf23ec40aaf45392afc6536c7cf1740d077bf468aaa7200c087b7d2", 1,
        "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
        "7afdad5199ae3427783bca4e392ece8525431ec3345d08e231de7fa6bd4938ab",
        "32633edc9ed7acc9407935db0820921abdc446a7c0c0203d279740fc0b26425b",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeBlindTx(handle, blind_handle, base_tx, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STRNE(base_tx, tx_string);
  }

  if (blind_handle != nullptr) {
    CfdFreeBlindHandle(handle, blind_handle);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}